

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OISConsole.cpp
# Opt level: O2

bool __thiscall EventHandler::povMoved(EventHandler *this,JoyStickEvent *arg,int pov)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<(poVar2,(string *)(*(long *)(arg + 8) + 8));
  poVar2 = std::operator<<(poVar2,". POV");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,pov);
  std::operator<<(poVar2," ");
  lVar4 = (long)pov;
  uVar1 = *(uint *)(*(long *)(arg + 0x10) + 0x44 + lVar4 * 8);
  if ((uVar1 & 1) == 0) {
    if ((uVar1 & 0x10) != 0) {
      pcVar3 = "South";
      goto LAB_001056a1;
    }
  }
  else {
    pcVar3 = "North";
LAB_001056a1:
    std::operator<<((ostream *)&std::cout,pcVar3);
  }
  uVar1 = *(uint *)(*(long *)(arg + 0x10) + 0x44 + lVar4 * 8);
  if ((uVar1 >> 8 & 1) == 0) {
    if ((uVar1 >> 0xc & 1) == 0) goto LAB_001056de;
    pcVar3 = "West";
  }
  else {
    pcVar3 = "East";
  }
  std::operator<<((ostream *)&std::cout,pcVar3);
LAB_001056de:
  if (*(int *)(*(long *)(arg + 0x10) + 0x44 + lVar4 * 8) == 0) {
    std::operator<<((ostream *)&std::cout,"Centered");
  }
  return true;
}

Assistant:

bool povMoved(const JoyStickEvent& arg, int pov)
	{
		std::cout << std::endl
				  << arg.device->vendor() << ". POV" << pov << " ";

		if(arg.state.mPOV[pov].direction & Pov::North) //Going up
			std::cout << "North";
		else if(arg.state.mPOV[pov].direction & Pov::South) //Going down
			std::cout << "South";

		if(arg.state.mPOV[pov].direction & Pov::East) //Going right
			std::cout << "East";
		else if(arg.state.mPOV[pov].direction & Pov::West) //Going left
			std::cout << "West";

		if(arg.state.mPOV[pov].direction == Pov::Centered) //stopped/centered out
			std::cout << "Centered";
		return true;
	}